

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O0

int __thiscall cmProcess::GetNextOutputLine(cmProcess *this,string *line,double timeout)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  double dVar4;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_c8;
  const_iterator local_c0;
  string local_b8;
  char *local_98;
  char *local_90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_80;
  const_iterator local_78;
  int local_70;
  int local_6c;
  int p;
  int length;
  char *data;
  undefined1 local_50 [8];
  string strdata;
  double dStack_28;
  cmProcessOutput processOutput;
  double timeout_local;
  string *line_local;
  cmProcess *this_local;
  
  dStack_28 = timeout;
  cmProcessOutput::cmProcessOutput
            ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),UTF8,0x400);
  std::__cxx11::string::string((string *)local_50);
  do {
    bVar1 = Buffer::GetLine(&this->Output,line);
    if (bVar1) {
      this_local._4_4_ = 2;
LAB_0063321c:
      data._0_4_ = 1;
      std::__cxx11::string::~string((string *)local_50);
      cmProcessOutput::~cmProcessOutput((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf));
      return this_local._4_4_;
    }
    local_70 = cmsysProcess_WaitForData
                         (this->Process,(char **)&p,&local_6c,&stack0xffffffffffffffd8);
    if (local_70 == 0xff) {
      this_local._4_4_ = 0xff;
      goto LAB_0063321c;
    }
    if (local_70 != 2) {
      std::__cxx11::string::string((string *)&local_b8);
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),&local_b8,
                 (string *)local_50,0);
      std::__cxx11::string::~string((string *)&local_b8);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        local_c8._M_current =
             (char *)std::vector<char,_std::allocator<char>_>::end
                               (&(this->Output).super_vector<char,_std::allocator<char>_>);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)
                   &local_c0,&local_c8);
        __first._M_current = (char *)std::__cxx11::string::begin();
        __last._M_current = (char *)std::__cxx11::string::end();
        std::vector<char,std::allocator<char>>::
        insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  ((vector<char,std::allocator<char>> *)&this->Output,local_c0,__first,__last);
      }
      bVar1 = Buffer::GetLast(&this->Output,line);
      if (bVar1) {
        this_local._4_4_ = 2;
      }
      else {
        iVar2 = cmsysProcess_WaitForExit(this->Process,&stack0xffffffffffffffd8);
        if (iVar2 == 0) {
          this_local._4_4_ = 0xff;
        }
        else {
          iVar2 = cmsysProcess_GetExitValue(this->Process);
          this->ExitValue = iVar2;
          dVar4 = cmsys::SystemTools::GetTime();
          this->TotalTime = dVar4 - this->StartTime;
          if (this->TotalTime <= 0.0) {
            this->TotalTime = 0.0;
          }
          this_local._4_4_ = 0;
        }
      }
      goto LAB_0063321c;
    }
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),_p,(long)local_6c,
               (string *)local_50,0);
    local_80._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::end
                           (&(this->Output).super_vector<char,_std::allocator<char>_>);
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_78,
               &local_80);
    local_88._M_current = (char *)std::__cxx11::string::begin();
    local_90 = (char *)std::__cxx11::string::end();
    local_98 = (char *)std::vector<char,std::allocator<char>>::
                       insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                                 ((vector<char,std::allocator<char>> *)&this->Output,local_78,
                                  local_88,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            )local_90);
  } while( true );
}

Assistant:

int cmProcess::GetNextOutputLine(std::string& line, double timeout)
{
  cmProcessOutput processOutput(cmProcessOutput::UTF8);
  std::string strdata;
  for (;;) {
    // Look for lines already buffered.
    if (this->Output.GetLine(line)) {
      return cmsysProcess_Pipe_STDOUT;
    }

    // Check for more data from the process.
    char* data;
    int length;
    int p = cmsysProcess_WaitForData(this->Process, &data, &length, &timeout);
    if (p == cmsysProcess_Pipe_Timeout) {
      return cmsysProcess_Pipe_Timeout;
    }
    if (p == cmsysProcess_Pipe_STDOUT) {
      processOutput.DecodeText(data, length, strdata);
      this->Output.insert(this->Output.end(), strdata.begin(), strdata.end());
    } else { // p == cmsysProcess_Pipe_None
      // The process will provide no more data.
      break;
    }
  }
  processOutput.DecodeText(std::string(), strdata);
  if (!strdata.empty()) {
    this->Output.insert(this->Output.end(), strdata.begin(), strdata.end());
  }

  // Look for partial last lines.
  if (this->Output.GetLast(line)) {
    return cmsysProcess_Pipe_STDOUT;
  }

  // No more data.  Wait for process exit.
  if (!cmsysProcess_WaitForExit(this->Process, &timeout)) {
    return cmsysProcess_Pipe_Timeout;
  }

  // Record exit information.
  this->ExitValue = cmsysProcess_GetExitValue(this->Process);
  this->TotalTime = cmSystemTools::GetTime() - this->StartTime;
  // Because of a processor clock scew the runtime may become slightly
  // negative. If someone changed the system clock while the process was
  // running this may be even more. Make sure not to report a negative
  // duration here.
  if (this->TotalTime <= 0.0) {
    this->TotalTime = 0.0;
  }
  //  std::cerr << "Time to run: " << this->TotalTime << "\n";
  return cmsysProcess_Pipe_None;
}